

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O0

int x509_name_cmp(mbedtls_x509_name *a,mbedtls_x509_name *b)

{
  int iVar1;
  mbedtls_x509_name *local_20;
  mbedtls_x509_name *b_local;
  mbedtls_x509_name *a_local;
  
  local_20 = b;
  b_local = a;
  while( true ) {
    if (b_local == (mbedtls_x509_name *)0x0 && local_20 == (mbedtls_x509_name *)0x0) {
      return 0;
    }
    if ((b_local == (mbedtls_x509_name *)0x0) || (local_20 == (mbedtls_x509_name *)0x0)) {
      return -1;
    }
    if ((((b_local->oid).tag != (local_20->oid).tag) || ((b_local->oid).len != (local_20->oid).len))
       || (iVar1 = memcmp((b_local->oid).p,(local_20->oid).p,(local_20->oid).len), iVar1 != 0)) {
      return -1;
    }
    iVar1 = x509_string_cmp(&b_local->val,&local_20->val);
    if (iVar1 != 0) {
      return -1;
    }
    if (b_local->next_merged != local_20->next_merged) break;
    b_local = b_local->next;
    local_20 = local_20->next;
  }
  return -1;
}

Assistant:

static int x509_name_cmp( const mbedtls_x509_name *a, const mbedtls_x509_name *b )
{
    /* Avoid recursion, it might not be optimised by the compiler */
    while( a != NULL || b != NULL )
    {
        if( a == NULL || b == NULL )
            return( -1 );

        /* type */
        if( a->oid.tag != b->oid.tag ||
            a->oid.len != b->oid.len ||
            memcmp( a->oid.p, b->oid.p, b->oid.len ) != 0 )
        {
            return( -1 );
        }

        /* value */
        if( x509_string_cmp( &a->val, &b->val ) != 0 )
            return( -1 );

        /* structure of the list of sets */
        if( a->next_merged != b->next_merged )
            return( -1 );

        a = a->next;
        b = b->next;
    }

    /* a == NULL == b */
    return( 0 );
}